

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftRigidDynamicsWorld::serialize(btSoftRigidDynamicsWorld *this,btSerializer *serializer)

{
  long *in_RSI;
  btSerializer *in_stack_00000018;
  btSoftRigidDynamicsWorld *in_stack_00000020;
  btSerializer *in_stack_00000038;
  btDiscreteDynamicsWorld *in_stack_00000040;
  btSerializer *in_stack_000000e8;
  btCollisionWorld *in_stack_000000f0;
  
  (**(code **)(*in_RSI + 0x40))();
  btDiscreteDynamicsWorld::serializeDynamicsWorldInfo
            (&this->super_btDiscreteDynamicsWorld,serializer);
  serializeSoftBodies(in_stack_00000020,in_stack_00000018);
  btDiscreteDynamicsWorld::serializeRigidBodies(in_stack_00000040,in_stack_00000038);
  btCollisionWorld::serializeCollisionObjects(in_stack_000000f0,in_stack_000000e8);
  (**(code **)(*in_RSI + 0x48))();
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::serialize(btSerializer* serializer)
{

	serializer->startSerialization();

	serializeDynamicsWorldInfo( serializer);

	serializeSoftBodies(serializer);

	serializeRigidBodies(serializer);

	serializeCollisionObjects(serializer);

	serializer->finishSerialization();
}